

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::makesegmentendpointsmap(tetgenmesh *this)

{
  undefined1 auVar1 [16];
  arraypool *this_00;
  point *ppdVar2;
  ulong uVar3;
  int iVar4;
  uint local_6c;
  int local_68;
  int i;
  int idx;
  int segindex;
  point *parypt;
  point edest;
  point eorg;
  face nextseg;
  face prevseg;
  face segloop;
  arraypool *segptlist;
  tetgenmesh *this_local;
  
  face::face((face *)&prevseg.shver);
  face::face((face *)&nextseg.shver);
  face::face((face *)&eorg);
  i = 0;
  local_68 = 0;
  if (0 < this->b->verbose) {
    printf("  Creating the segment-endpoints map.\n");
  }
  this_00 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(this_00,0x10,10);
  memorypool::traversalinit(this->subsegs);
  prevseg._8_8_ = shellfacetraverse(this,this->subsegs);
  while (prevseg._8_8_ != 0) {
    senext2(this,(face *)&prevseg.shver,(face *)&nextseg.shver);
    spivotself(this,(face *)&nextseg.shver);
    if (nextseg._8_8_ == 0) {
      edest = sorg(this,(face *)&prevseg.shver);
      parypt = (point *)sdest(this,(face *)&prevseg.shver);
      setfacetindex(this,(face *)&prevseg.shver,i);
      senext(this,(face *)&prevseg.shver,(face *)&eorg);
      spivotself(this,(face *)&eorg);
      while (eorg != (point)0x0) {
        setfacetindex(this,(face *)&eorg,i);
        nextseg.sh._0_4_ = 0;
        ppdVar2 = (point *)sorg(this,(face *)&eorg);
        if (ppdVar2 != parypt) {
          sesymself(this,(face *)&eorg);
        }
        parypt = (point *)sdest(this,(face *)&eorg);
        senextself(this,(face *)&eorg);
        spivotself(this,(face *)&eorg);
      }
      arraypool::newindex(this_00,(void **)&idx);
      *(point *)_idx = edest;
      *(point **)(_idx + 8) = parypt;
      i = i + 1;
    }
    prevseg._8_8_ = shellfacetraverse(this,this->subsegs);
  }
  if (this->b->verbose != 0) {
    printf("  Found %ld segments.\n",this_00->objects);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this_00->objects << 1;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppdVar2 = (point *)operator_new__(uVar3);
  this->segmentendpointslist = ppdVar2;
  this->totalworkmemory = this_00->objects * 0x10 + this->totalworkmemory;
  for (local_6c = 0; (long)(int)local_6c < this_00->objects; local_6c = local_6c + 1) {
    _idx = this_00->toparray[(int)local_6c >> ((byte)this_00->log2objectsperblock & 0x1f)] +
           (int)((local_6c & this_00->objectsperblockmark) * this_00->objectbytes);
    iVar4 = local_68 + 1;
    this->segmentendpointslist[local_68] = *(point *)_idx;
    local_68 = local_68 + 2;
    this->segmentendpointslist[iVar4] = *(point *)(_idx + 8);
  }
  if (this_00 != (arraypool *)0x0) {
    arraypool::~arraypool(this_00);
    operator_delete(this_00,0x30);
  }
  return;
}

Assistant:

void tetgenmesh::makesegmentendpointsmap()
{
  arraypool *segptlist;
  face segloop, prevseg, nextseg;
  point eorg, edest, *parypt;
  int segindex = 0, idx = 0;
  int i;

  if (b->verbose > 0) {
    printf("  Creating the segment-endpoints map.\n");
  }

  segptlist = new arraypool(2 * sizeof(point), 10);

  // A segment s may have been split into many subsegments. Operate the one
  //   which contains the origin of s. Then mark the rest of subsegments.
  subsegs->traversalinit();
  segloop.sh = shellfacetraverse(subsegs);
  segloop.shver = 0;
  while (segloop.sh != NULL) {
    senext2(segloop, prevseg);
    spivotself(prevseg);
    if (prevseg.sh == NULL) {
      eorg = sorg(segloop);
      edest = sdest(segloop);
      setfacetindex(segloop, segindex);
      senext(segloop, nextseg);
      spivotself(nextseg);
      while (nextseg.sh != NULL) {
        setfacetindex(nextseg, segindex);
        nextseg.shver = 0;
        if (sorg(nextseg) != edest) sesymself(nextseg);
        edest = sdest(nextseg);
        // Go the next connected subsegment at edest.
        senextself(nextseg);
        spivotself(nextseg);
      }
      segptlist->newindex((void **) &parypt);
      parypt[0] = eorg;
      parypt[1] = edest;
      segindex++;
    }
    segloop.sh = shellfacetraverse(subsegs);
  }

  if (b->verbose) {
    printf("  Found %ld segments.\n", segptlist->objects);
  }

  segmentendpointslist = new point[segptlist->objects * 2];

  totalworkmemory += (segptlist->objects * 2) * sizeof(point *);

  for (i = 0; i < segptlist->objects; i++) {
    parypt = (point *) fastlookup(segptlist, i);
    segmentendpointslist[idx++] = parypt[0];
    segmentendpointslist[idx++] = parypt[1];
  }

  delete segptlist;
}